

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemIOCallback.cpp
# Opt level: O0

ssize_t __thiscall
libebml::MemIOCallback::read(MemIOCallback *this,int __fd,void *__buf,size_t __nbytes)

{
  uint64 uVar1;
  undefined4 in_register_00000034;
  void *__dest;
  uint64 oldDataPos;
  size_t Size_local;
  void *Buffer_local;
  MemIOCallback *this_local;
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  if ((__dest == (void *)0x0) || (__buf == (void *)0x0)) {
    this_local._4_4_ = 0;
  }
  else if (this->dataBufferTotalSize < (long)__buf + this->dataBufferPos) {
    memcpy(__dest,this->dataBuffer + this->dataBufferPos,
           this->dataBufferTotalSize - this->dataBufferPos);
    uVar1 = this->dataBufferPos;
    this->dataBufferPos = this->dataBufferTotalSize;
    this_local._4_4_ = (int)this->dataBufferTotalSize - (int)uVar1;
  }
  else {
    memcpy(__dest,this->dataBuffer + this->dataBufferPos,(size_t)__buf);
    this->dataBufferPos = (long)__buf + this->dataBufferPos;
    this_local._4_4_ = (uint)__buf;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

uint32 MemIOCallback::read(void *Buffer, size_t Size)
{
  if (Buffer == NULL || Size < 1)
    return 0;
  //If the size is larger than than the amount left in the buffer
  if (Size + dataBufferPos > dataBufferTotalSize) {
    //We will only return the remaining data
    memcpy(Buffer, dataBuffer + dataBufferPos, dataBufferTotalSize - dataBufferPos);
    uint64 oldDataPos = dataBufferPos;
    dataBufferPos = dataBufferTotalSize;
    return dataBufferTotalSize - oldDataPos;
  }

  //Well... We made it here, so do a quick and simple copy
  memcpy(Buffer, dataBuffer+dataBufferPos, Size);
  dataBufferPos += Size;

  return Size;
}